

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

bool __thiscall duckdb::EnumTypeInfo::EqualsInternal(EnumTypeInfo *this,ExtraTypeInfo *other_p)

{
  bool bVar1;
  string_t *b;
  string_t *a;
  ulong uVar2;
  bool bVar3;
  
  if ((this->dict_type ==
       *(EnumDictType *)
        &other_p[2].extension_info.
         super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl) &&
     (other_p[3]._vptr_ExtraTypeInfo == (_func_int **)this->dict_size)) {
    uVar2 = 0xffffffffffffffff;
    b = (string_t *)(this->values_insert_order).data;
    a = (string_t *)other_p[1].alias.field_2._M_allocated_capacity;
    do {
      uVar2 = uVar2 + 1;
      bVar3 = this->dict_size <= uVar2;
      if (bVar3) {
        return bVar3;
      }
      bVar1 = string_t::StringComparisonOperators::Equals(a,b);
      b = b + 1;
      a = a + 1;
    } while (bVar1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EnumTypeInfo::EqualsInternal(ExtraTypeInfo *other_p) const {
	auto &other = other_p->Cast<EnumTypeInfo>();
	if (dict_type != other.dict_type) {
		return false;
	}
	D_ASSERT(dict_type == EnumDictType::VECTOR_DICT);
	// We must check if both enums have the same size
	if (other.dict_size != dict_size) {
		return false;
	}
	auto other_vector_ptr = FlatVector::GetData<string_t>(other.values_insert_order);
	auto this_vector_ptr = FlatVector::GetData<string_t>(values_insert_order);

	// Now we must check if all strings are the same
	for (idx_t i = 0; i < dict_size; i++) {
		if (!Equals::Operation(other_vector_ptr[i], this_vector_ptr[i])) {
			return false;
		}
	}
	return true;
}